

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O1

string * __thiscall
cmOutputConverter::EscapeForCMake_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,string_view str,
          WrapQuotes wrapQuotes)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  cmOutputConverter *pcVar4;
  
  iVar3 = (int)str._M_str;
  pcVar2 = "PK\x01\x02";
  if (iVar3 == 0) {
    pcVar2 = "\n\t\t\t\"";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar2 + 4,pcVar2 + 4 + (iVar3 == 0));
  if (this != (cmOutputConverter *)0x0) {
    pcVar4 = (cmOutputConverter *)0x0;
    do {
      cVar1 = *(char *)((long)&pcVar4->_vptr_cmOutputConverter + str._M_len);
      if (((cVar1 == '\\') || (cVar1 == '$')) || (cVar1 == '\"')) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      pcVar4 = (cmOutputConverter *)((long)&pcVar4->_vptr_cmOutputConverter + 1);
    } while (this != pcVar4);
  }
  if (iVar3 == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::EscapeForCMake(cm::string_view str,
                                              WrapQuotes wrapQuotes)
{
  // Always double-quote the argument to take care of most escapes.
  std::string result = (wrapQuotes == WrapQuotes::Wrap) ? "\"" : "";
  for (const char c : str) {
    if (c == '"') {
      // Escape the double quote to avoid ending the argument.
      result += "\\\"";
    } else if (c == '$') {
      // Escape the dollar to avoid expanding variables.
      result += "\\$";
    } else if (c == '\\') {
      // Escape the backslash to avoid other escapes.
      result += "\\\\";
    } else {
      // Other characters will be parsed correctly.
      result += c;
    }
  }
  if (wrapQuotes == WrapQuotes::Wrap) {
    result += "\"";
  }
  return result;
}